

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

void mgf_mask(uchar *dst,size_t dlen,uchar *src,size_t slen,mbedtls_md_context_t *md_ctx)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  uchar counter [4];
  uchar mask [64];
  uchar local_8c [4];
  uchar *local_88;
  size_t local_80;
  byte local_78 [72];
  
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[0x10] = 0;
  local_78[0x11] = 0;
  local_78[0x12] = 0;
  local_78[0x13] = 0;
  local_78[0x14] = 0;
  local_78[0x15] = 0;
  local_78[0x16] = 0;
  local_78[0x17] = 0;
  local_78[0x18] = 0;
  local_78[0x19] = 0;
  local_78[0x1a] = 0;
  local_78[0x1b] = 0;
  local_78[0x1c] = 0;
  local_78[0x1d] = 0;
  local_78[0x1e] = 0;
  local_78[0x1f] = 0;
  local_78[0x20] = 0;
  local_78[0x21] = 0;
  local_78[0x22] = 0;
  local_78[0x23] = 0;
  local_78[0x24] = 0;
  local_78[0x25] = 0;
  local_78[0x26] = 0;
  local_78[0x27] = 0;
  local_78[0x28] = 0;
  local_78[0x29] = 0;
  local_78[0x2a] = 0;
  local_78[0x2b] = 0;
  local_78[0x2c] = 0;
  local_78[0x2d] = 0;
  local_78[0x2e] = 0;
  local_78[0x2f] = 0;
  local_78[0x30] = 0;
  local_78[0x31] = 0;
  local_78[0x32] = 0;
  local_78[0x33] = 0;
  local_78[0x34] = 0;
  local_78[0x35] = 0;
  local_78[0x36] = 0;
  local_78[0x37] = 0;
  local_78[0x38] = 0;
  local_78[0x39] = 0;
  local_78[0x3a] = 0;
  local_78[0x3b] = 0;
  local_78[0x3c] = 0;
  local_78[0x3d] = 0;
  local_78[0x3e] = 0;
  local_78[0x3f] = 0;
  local_8c[0] = '\0';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  local_88 = src;
  local_80 = slen;
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  if (dlen != 0) {
    do {
      uVar3 = (ulong)bVar1;
      if (dlen < bVar1) {
        uVar3 = dlen;
      }
      mbedtls_md_starts(md_ctx);
      mbedtls_md_update(md_ctx,local_88,local_80);
      mbedtls_md_update(md_ctx,local_8c,4);
      mbedtls_md_finish(md_ctx,local_78);
      if (bVar1 != 0) {
        lVar2 = 0;
        do {
          dst[lVar2] = dst[lVar2] ^ local_78[lVar2];
          lVar2 = lVar2 + 1;
        } while (uVar3 + (uVar3 == 0) != lVar2);
        dst = dst + lVar2;
      }
      local_8c[3] = local_8c[3] + '\x01';
      dlen = dlen - uVar3;
    } while (dlen != 0);
  }
  return;
}

Assistant:

static void mgf_mask( unsigned char *dst, size_t dlen, unsigned char *src,
                      size_t slen, mbedtls_md_context_t *md_ctx )
{
    unsigned char mask[MBEDTLS_MD_MAX_SIZE];
    unsigned char counter[4];
    unsigned char *p;
    unsigned int hlen;
    size_t i, use_len;

    memset( mask, 0, MBEDTLS_MD_MAX_SIZE );
    memset( counter, 0, 4 );

    hlen = mbedtls_md_get_size( md_ctx->md_info );

    /* Generate and apply dbMask */
    p = dst;

    while( dlen > 0 )
    {
        use_len = hlen;
        if( dlen < hlen )
            use_len = dlen;

        mbedtls_md_starts( md_ctx );
        mbedtls_md_update( md_ctx, src, slen );
        mbedtls_md_update( md_ctx, counter, 4 );
        mbedtls_md_finish( md_ctx, mask );

        for( i = 0; i < use_len; ++i )
            *p++ ^= mask[i];

        counter[3]++;

        dlen -= use_len;
    }
}